

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_create_map_iterator(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue v;
  JSValue obj;
  JSValue v_00;
  JSValue JVar1;
  int iVar2;
  void *pvVar3;
  JSValueUnion *opaque;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  int in_R9D;
  JSValue JVar4;
  JSValue enum_obj;
  JSMapIteratorData *it;
  JSMapState *s;
  JSIteratorKindEnum kind;
  undefined8 in_stack_ffffffffffffff78;
  JSContext *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  JSClassID in_stack_ffffffffffffff8c;
  JSContext *in_stack_ffffffffffffff90;
  JSValueUnion size;
  JSValueUnion in_stack_ffffffffffffff98;
  JSContext *ctx_00;
  int64_t in_stack_ffffffffffffffa0;
  JSValueUnion JVar5;
  int32_t local_10;
  undefined4 uStack_c;
  JSContext *local_8;
  
  JVar4.tag = in_stack_ffffffffffffffa0;
  JVar4.u.float64 = in_stack_ffffffffffffff98.float64;
  pvVar3 = JS_GetOpaque2(in_stack_ffffffffffffff90,JVar4,in_stack_ffffffffffffff8c);
  if (pvVar3 == (void *)0x0) {
    local_10 = 0;
    local_8 = (JSContext *)0x6;
  }
  else {
    JVar4 = JS_NewObjectClass(in_stack_ffffffffffffff80,
                              (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    size = JVar4.u;
    local_8 = (JSContext *)JVar4.tag;
    ctx_00 = local_8;
    JVar5 = size;
    iVar2 = JS_IsException(JVar4);
    if (iVar2 == 0) {
      opaque = (JSValueUnion *)js_malloc(ctx_00,(size_t)size);
      if (opaque != (JSValueUnion *)0x0) {
        v_00.tag = in_RDX;
        v_00.u.float64 = in_RSI.float64;
        JVar4 = JS_DupValue(in_RDI,v_00);
        *opaque = JVar4.u;
        opaque[1] = (JSValueUnion)JVar4.tag;
        opaque[2].int32 = in_R9D >> 2;
        opaque[3].float64 = 0.0;
        obj.tag = (int64_t)local_8;
        obj.u.float64 = JVar5.float64;
        JS_SetOpaque(obj,opaque);
        local_10 = JVar5.int32;
        uStack_c = JVar5._4_4_;
        goto LAB_0017e8e1;
      }
      v.u._4_4_ = in_stack_ffffffffffffff8c;
      v.u.int32 = in_stack_ffffffffffffff88;
      v.tag = (int64_t)size.ptr;
      JS_FreeValue(in_stack_ffffffffffffff80,v);
    }
    local_10 = 0;
    local_8 = (JSContext *)0x6;
  }
LAB_0017e8e1:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8;
  return JVar1;
}

Assistant:

static JSValue js_create_map_iterator(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv, int magic)
{
    JSIteratorKindEnum kind;
    JSMapState *s;
    JSMapIteratorData *it;
    JSValue enum_obj;

    kind = magic >> 2;
    magic &= 3;
    s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    if (!s)
        return JS_EXCEPTION;
    enum_obj = JS_NewObjectClass(ctx, JS_CLASS_MAP_ITERATOR + magic);
    if (JS_IsException(enum_obj))
        goto fail;
    it = js_malloc(ctx, sizeof(*it));
    if (!it) {
        JS_FreeValue(ctx, enum_obj);
        goto fail;
    }
    it->obj = JS_DupValue(ctx, this_val);
    it->kind = kind;
    it->cur_record = NULL;
    JS_SetOpaque(enum_obj, it);
    return enum_obj;
 fail:
    return JS_EXCEPTION;
}